

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.c
# Opt level: O1

int nn_sock_rm_ep(nn_sock *self,int eid)

{
  nn_list *self_00;
  nn_list_item *pnVar1;
  nn_list_item *pnVar2;
  int iVar3;
  nn_ep *self_01;
  
  nn_ctx_enter(&self->ctx);
  self_00 = &self->eps;
  pnVar1 = nn_list_begin(self_00);
  while( true ) {
    pnVar2 = nn_list_end(self_00);
    if (pnVar1 == pnVar2) break;
    self_01 = (nn_ep *)&pnVar1[-8].prev;
    if (pnVar1 == (nn_list_item *)0x0) {
      self_01 = (nn_ep *)0x0;
    }
    if (self_01->eid == eid) goto LAB_0019f692;
    pnVar1 = nn_list_next(self_00,pnVar1);
  }
  self_01 = (nn_ep *)0x0;
LAB_0019f692:
  if (self_01 == (nn_ep *)0x0) {
    iVar3 = -0x16;
  }
  else {
    nn_list_erase(self_00,&self_01->item);
    pnVar1 = nn_list_end(&self->sdeps);
    nn_list_insert(&self->sdeps,&self_01->item,pnVar1);
    nn_ep_stop(self_01);
    iVar3 = 0;
  }
  nn_ctx_leave(&self->ctx);
  return iVar3;
}

Assistant:

int nn_sock_rm_ep (struct nn_sock *self, int eid)
{
    struct nn_list_item *it;
    struct nn_ep *ep;

    nn_ctx_enter (&self->ctx);

    /*  Find the specified enpoint. */
    ep = NULL;
    for (it = nn_list_begin (&self->eps);
          it != nn_list_end (&self->eps);
          it = nn_list_next (&self->eps, it)) {
        ep = nn_cont (it, struct nn_ep, item);
        if (ep->eid == eid)
            break;
        ep = NULL;
    }

    /*  The endpoint doesn't exist. */
    if (!ep) {
        nn_ctx_leave (&self->ctx);
        return -EINVAL;
    }

    /*  Move the endpoint from the list of active endpoints to the list
        of shutting down endpoints. */
    nn_list_erase (&self->eps, &ep->item);
    nn_list_insert (&self->sdeps, &ep->item, nn_list_end (&self->sdeps));

    /*  Ask the endpoint to stop. Actual terminatation may be delayed
        by the transport. */
    nn_ep_stop (ep);

    nn_ctx_leave (&self->ctx);

    return 0;
}